

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O1

void __thiscall singleParticleSpectra::output_two_particle_correlation(singleParticleSpectra *this)

{
  char *pcVar1;
  size_type sVar2;
  undefined8 uVar3;
  ostream *poVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  ofstream output_os;
  ofstream output_ss;
  ofstream output;
  ostringstream filename_os;
  ostringstream filename_ss;
  ostringstream filename;
  double local_ae0;
  double local_ad8;
  double local_ad0;
  char *local_ab8;
  char local_aa8 [16];
  char *local_a98;
  filebuf local_a90 [8];
  char local_a88 [8];
  uint auStack_a80 [56];
  ios_base aiStack_9a0 [264];
  char *local_898;
  filebuf local_890 [8];
  char local_888 [8];
  uint auStack_880 [56];
  ios_base aiStack_7a0 [264];
  char *local_698;
  filebuf local_690 [8];
  undefined8 uStack_688;
  uint auStack_680 [56];
  ios_base local_5a0 [264];
  ostringstream local_498 [112];
  ios_base local_428 [264];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  sVar2 = (this->path_)._M_string_length;
  if (this->rap_type == 0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/particle_",10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_vn2",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_eta_",5);
    poVar4 = std::ostream::_M_insert<double>(this->rap_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
  }
  else {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/particle_",10);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_vn2",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_y_",3);
    poVar4 = std::ostream::_M_insert<double>(this->rap_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
  }
  poVar4 = std::ostream::_M_insert<double>(this->rap_max);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".dat",4);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_698,local_898,_S_out);
  if (local_898 != local_888) {
    operator_delete(local_898);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_698,"# n  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>",0x37);
  std::ios::widen((char)(ostream *)&local_698 + (char)*(undefined8 *)(local_698 + -0x18));
  std::ostream::put((char)&local_698);
  std::ostream::flush();
  dVar7 = (double)this->total_number_of_events;
  dVar8 = *(this->Qn2_vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start / dVar7;
  dVar6 = *(this->Qn2_vector_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start / dVar7 - dVar8 * dVar8;
  local_ae0 = 0.0;
  if (0.0 < dVar6) {
    dVar6 = dVar6 / dVar7;
    if (dVar6 < 0.0) {
      local_ae0 = sqrt(dVar6);
    }
    else {
      local_ae0 = SQRT(dVar6);
    }
  }
  *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) =
       *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)((long)&uStack_688 + *(long *)(local_698 + -0x18)) = 0x12;
  *(undefined8 *)(local_690 + *(long *)(local_698 + -0x18)) = 8;
  poVar4 = (ostream *)std::ostream::operator<<(&local_698,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
  poVar4 = std::ostream::_M_insert<double>(dVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
  poVar4 = std::ostream::_M_insert<double>(local_ae0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
  poVar4 = std::ostream::_M_insert<double>(dVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
  poVar4 = std::ostream::_M_insert<double>
                     (*(this->Qn2_vector_err).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start /
                      (double)this->total_number_of_events);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (1 < this->order_max) {
    lVar5 = 1;
    do {
      dVar6 = (this->Qn2_vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5] / (double)this->total_number_of_events;
      local_ad0 = 0.0;
      local_ad8 = 0.0;
      if (0.0 < dVar6) {
        local_ad8 = dVar6 / dVar8;
        if (local_ad8 < 0.0) {
          local_ad8 = sqrt(local_ad8);
        }
        else {
          local_ad8 = SQRT(local_ad8);
        }
        dVar7 = (this->Qn2_vector_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5] / (double)this->total_number_of_events -
                dVar6 * dVar6;
        local_ad0 = 0.0;
        if (0.0 < dVar7) {
          dVar7 = dVar7 / (double)this->total_number_of_events;
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          local_ad0 = dVar7 / dVar8;
        }
      }
      *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) =
           *(uint *)((long)auStack_680 + *(long *)(local_698 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)&uStack_688 + *(long *)(local_698 + -0x18)) = 0x12;
      *(undefined8 *)(local_690 + *(long *)(local_698 + -0x18)) = 8;
      poVar4 = (ostream *)std::ostream::operator<<(&local_698,(int)lVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      poVar4 = std::ostream::_M_insert<double>(local_ad8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      poVar4 = std::ostream::_M_insert<double>(local_ad0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      poVar4 = std::ostream::_M_insert<double>(dVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
      poVar4 = std::ostream::_M_insert<double>
                         ((this->Qn2_vector_err).super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar5] /
                          (double)this->total_number_of_events);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->order_max);
  }
  std::ofstream::close();
  if (this->flag_charge_dependence == 1) {
    std::__cxx11::ostringstream::ostringstream(local_320);
    std::__cxx11::ostringstream::ostringstream(local_498);
    pcVar1 = (this->path_)._M_dataplus._M_p;
    sVar2 = (this->path_)._M_string_length;
    if (this->rap_type == 0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar1,sVar2)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/particle_",10);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->particle_monval);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_Cn2_ss",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_eta_",5);
      poVar4 = std::ostream::_M_insert<double>(this->rap_min);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
      poVar4 = std::ostream::_M_insert<double>(this->rap_max);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,".dat",4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_498,(this->path_)._M_dataplus._M_p,
                          (this->path_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/particle_",10);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->particle_monval);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_Cn2_os",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_eta_",5);
      poVar4 = std::ostream::_M_insert<double>(this->rap_min);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
    }
    else {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar1,sVar2)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/particle_",10);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->particle_monval);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_Cn2_ss",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_y_",3);
      poVar4 = std::ostream::_M_insert<double>(this->rap_min);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
      poVar4 = std::ostream::_M_insert<double>(this->rap_max);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,".dat",4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_498,(this->path_)._M_dataplus._M_p,
                          (this->path_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/particle_",10);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->particle_monval);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_Cn2_os",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_y_",3);
      poVar4 = std::ostream::_M_insert<double>(this->rap_min);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
    }
    poVar4 = std::ostream::_M_insert<double>(this->rap_max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".dat",4);
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&local_898,local_a98,_S_out);
    if (local_a98 != local_a88) {
      operator_delete(local_a98);
    }
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&local_a98,local_ab8,_S_out);
    if (local_ab8 != local_aa8) {
      operator_delete(local_ab8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_898,"# n  vn{2}  vn{2}_err  Cn2_ss  Cn2_ss_err",0x29);
    std::ios::widen((char)(ostream *)&local_898 + (char)*(undefined8 *)(local_898 + -0x18));
    std::ostream::put((char)&local_898);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_a98,"# n  vn{2}  vn{2}_err  Cn2_os  Cn2_os_err",0x29);
    std::ios::widen((char)(ostream *)&local_a98 + (char)*(undefined8 *)(local_a98 + -0x18));
    std::ostream::put((char)&local_a98);
    std::ostream::flush();
    dVar7 = (double)this->total_number_of_events;
    dVar8 = *(this->Cn2_ss).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar7;
    dVar6 = *(this->Cn2_ss_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar7 - dVar8 * dVar8;
    local_ae0 = 0.0;
    if (0.0 < dVar6) {
      dVar6 = dVar6 / dVar7;
      if (dVar6 < 0.0) {
        local_ae0 = sqrt(dVar6);
      }
      else {
        local_ae0 = SQRT(dVar6);
      }
    }
    *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) =
         *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) & 0xfffffefb | 0x100;
    pcVar1 = local_888 + *(long *)(local_898 + -0x18);
    pcVar1[0] = '\x12';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    *(undefined8 *)(local_890 + *(long *)(local_898 + -0x18)) = 8;
    poVar4 = (ostream *)std::ostream::operator<<(&local_898,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
    poVar4 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
    poVar4 = std::ostream::_M_insert<double>(local_ae0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
    poVar4 = std::ostream::_M_insert<double>(dVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
    poVar4 = std::ostream::_M_insert<double>
                       (*(this->Cn2_ss_err).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start /
                        (double)this->total_number_of_events);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    dVar7 = (double)this->total_number_of_events;
    dVar9 = *(this->Cn2_os).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar7;
    dVar6 = *(this->Cn2_os_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start / dVar7 - dVar9 * dVar9;
    local_ae0 = 0.0;
    if (0.0 < dVar6) {
      dVar6 = dVar6 / dVar7;
      if (dVar6 < 0.0) {
        local_ae0 = sqrt(dVar6);
      }
      else {
        local_ae0 = SQRT(dVar6);
      }
    }
    *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) =
         *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) & 0xfffffefb | 0x100;
    pcVar1 = local_a88 + *(long *)(local_a98 + -0x18);
    pcVar1[0] = '\x12';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    *(undefined8 *)(local_a90 + *(long *)(local_a98 + -0x18)) = 8;
    poVar4 = (ostream *)std::ostream::operator<<(&local_a98,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
    poVar4 = std::ostream::_M_insert<double>(dVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
    poVar4 = std::ostream::_M_insert<double>(local_ae0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
    poVar4 = std::ostream::_M_insert<double>(dVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
    poVar4 = std::ostream::_M_insert<double>
                       (*(this->Cn2_os_err).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start /
                        (double)this->total_number_of_events);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (1 < this->order_max) {
      lVar5 = 1;
      do {
        dVar6 = (this->Cn2_ss).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5] / (double)this->total_number_of_events;
        local_ad0 = 0.0;
        local_ad8 = 0.0;
        if (0.0 < dVar6) {
          local_ad8 = dVar6 / dVar8;
          if (local_ad8 < 0.0) {
            local_ad8 = sqrt(local_ad8);
          }
          else {
            local_ad8 = SQRT(local_ad8);
          }
          dVar7 = (this->Cn2_ss_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5] / (double)this->total_number_of_events -
                  dVar6 * dVar6;
          local_ad0 = 0.0;
          if (0.0 < dVar7) {
            dVar7 = dVar7 / (double)this->total_number_of_events;
            if (dVar7 < 0.0) {
              dVar7 = sqrt(dVar7);
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            local_ad0 = dVar7 / dVar8;
          }
        }
        *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) =
             *(uint *)((long)auStack_880 + *(long *)(local_898 + -0x18)) & 0xfffffefb | 0x100;
        pcVar1 = local_888 + *(long *)(local_898 + -0x18);
        pcVar1[0] = '\x12';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        *(undefined8 *)(local_890 + *(long *)(local_898 + -0x18)) = 8;
        poVar4 = (ostream *)std::ostream::operator<<(&local_898,(int)lVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        poVar4 = std::ostream::_M_insert<double>(local_ad8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        poVar4 = std::ostream::_M_insert<double>(local_ad0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        poVar4 = std::ostream::_M_insert<double>(dVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        poVar4 = std::ostream::_M_insert<double>
                           ((this->Cn2_ss_err).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar5] /
                            (double)this->total_number_of_events);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        dVar6 = (this->Cn2_os).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5] / (double)this->total_number_of_events;
        local_ad0 = 0.0;
        local_ad8 = 0.0;
        if (0.0 < dVar6) {
          local_ad8 = dVar6 / dVar9;
          if (local_ad8 < 0.0) {
            local_ad8 = sqrt(local_ad8);
          }
          else {
            local_ad8 = SQRT(local_ad8);
          }
          dVar7 = (this->Cn2_os_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5] / (double)this->total_number_of_events -
                  dVar6 * dVar6;
          local_ad0 = 0.0;
          if (0.0 < dVar7) {
            dVar7 = dVar7 / (double)this->total_number_of_events;
            if (dVar7 < 0.0) {
              dVar7 = sqrt(dVar7);
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            local_ad0 = dVar7 / dVar9;
          }
        }
        *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) =
             *(uint *)((long)auStack_a80 + *(long *)(local_a98 + -0x18)) & 0xfffffefb | 0x100;
        pcVar1 = local_a88 + *(long *)(local_a98 + -0x18);
        pcVar1[0] = '\x12';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        *(undefined8 *)(local_a90 + *(long *)(local_a98 + -0x18)) = 8;
        poVar4 = (ostream *)std::ostream::operator<<(&local_a98,(int)lVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        poVar4 = std::ostream::_M_insert<double>(local_ad8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        poVar4 = std::ostream::_M_insert<double>(local_ad0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        poVar4 = std::ostream::_M_insert<double>(dVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        poVar4 = std::ostream::_M_insert<double>
                           ((this->Cn2_os_err).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar5] /
                            (double)this->total_number_of_events);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->order_max);
    }
    std::ofstream::close();
    std::ofstream::close();
    uVar3 = _log;
    pcVar1 = _VTT;
    local_a98 = _VTT;
    *(undefined8 *)(local_a90 + *(long *)(_VTT + -0x18) + -8) = _log;
    std::filebuf::~filebuf(local_a90);
    std::ios_base::~ios_base(aiStack_9a0);
    local_898 = pcVar1;
    *(undefined8 *)(local_890 + *(long *)(pcVar1 + -0x18) + -8) = uVar3;
    std::filebuf::~filebuf(local_890);
    std::ios_base::~ios_base(aiStack_7a0);
    std::__cxx11::ostringstream::~ostringstream(local_498);
    std::ios_base::~ios_base(local_428);
    std::__cxx11::ostringstream::~ostringstream(local_320);
    std::ios_base::~ios_base(local_2b0);
  }
  local_698 = _VTT;
  *(undefined8 *)(local_690 + *(long *)(_VTT + -0x18) + -8) = _log;
  std::filebuf::~filebuf(local_690);
  std::ios_base::~ios_base(local_5a0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void singleParticleSpectra::output_two_particle_correlation() {
    ostringstream filename;
    if (rap_type == 0) {
        filename << path_ << "/particle_" << particle_monval << "_vn2"
                 << "_eta_" << rap_min << "_" << rap_max << ".dat";
    } else {
        filename << path_ << "/particle_" << particle_monval << "_vn2"
                 << "_y_" << rap_min << "_" << rap_max << ".dat";
    }
    ofstream output(filename.str().c_str());
    output << "# n  vn{2}  vn{2}_err  <Qn*conj(Qn)>  <(Qn*conj(Qn))^2>" << endl;

    double num_pair = Qn2_vector[0] / total_number_of_events;
    double num_pair_stdsq =
        (Qn2_vector_err[0] / total_number_of_events - num_pair * num_pair);
    double num_pair_err = 0.0;
    if (num_pair_stdsq > 0) {
        num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
    }
    output << scientific << setw(18) << setprecision(8) << 0 << "  " << num_pair
           << "  " << num_pair_err << "  " << num_pair << "  "
           << Qn2_vector_err[0] / total_number_of_events << endl;
    for (int i = 1; i < order_max; i++) {
        double vn2_avg = 0.0;
        double vn2_err = 0.0;
        double Qn2_avg = Qn2_vector[i] / total_number_of_events;
        if (Qn2_avg > 0.) {
            vn2_avg = sqrt(Qn2_avg / num_pair);
            double Qn2_stdsq =
                (Qn2_vector_err[i] / total_number_of_events
                 - Qn2_avg * Qn2_avg);
            if (Qn2_stdsq > 0) {
                double Qn2_err = sqrt(Qn2_stdsq / total_number_of_events);
                vn2_err = Qn2_err / num_pair;
            }
        }
        output << scientific << setw(18) << setprecision(8) << i << "  "
               << vn2_avg << "  " << vn2_err << "  " << Qn2_avg << "  "
               << Qn2_vector_err[i] / total_number_of_events << endl;
    }
    output.close();

    if (flag_charge_dependence == 1) {
        ostringstream filename_ss;
        ostringstream filename_os;
        if (rap_type == 0) {
            filename_ss << path_ << "/particle_" << particle_monval << "_Cn2_ss"
                        << "_eta_" << rap_min << "_" << rap_max << ".dat";
            filename_os << path_ << "/particle_" << particle_monval << "_Cn2_os"
                        << "_eta_" << rap_min << "_" << rap_max << ".dat";
        } else {
            filename_ss << path_ << "/particle_" << particle_monval << "_Cn2_ss"
                        << "_y_" << rap_min << "_" << rap_max << ".dat";
            filename_os << path_ << "/particle_" << particle_monval << "_Cn2_os"
                        << "_y_" << rap_min << "_" << rap_max << ".dat";
        }
        ofstream output_ss(filename_ss.str().c_str());
        ofstream output_os(filename_os.str().c_str());
        output_ss << "# n  vn{2}  vn{2}_err  Cn2_ss  Cn2_ss_err" << endl;
        output_os << "# n  vn{2}  vn{2}_err  Cn2_os  Cn2_os_err" << endl;

        double num_pair_ss = Cn2_ss[0] / total_number_of_events;
        double num_pair_ss_stdsq =
            (Cn2_ss_err[0] / total_number_of_events
             - num_pair_ss * num_pair_ss);
        double num_pair_ss_err = 0.0;
        if (num_pair_ss_stdsq > 0) {
            num_pair_ss_err = sqrt(num_pair_ss_stdsq / total_number_of_events);
        }
        output_ss << scientific << setw(18) << setprecision(8) << 0 << "  "
                  << num_pair_ss << "  " << num_pair_ss_err << "  "
                  << num_pair_ss << "  "
                  << Cn2_ss_err[0] / total_number_of_events << endl;
        double num_pair_os = Cn2_os[0] / total_number_of_events;
        double num_pair_os_stdsq =
            (Cn2_os_err[0] / total_number_of_events
             - num_pair_os * num_pair_os);
        double num_pair_os_err = 0.0;
        if (num_pair_os_stdsq > 0) {
            num_pair_os_err = sqrt(num_pair_os_stdsq / total_number_of_events);
        }
        output_os << scientific << setw(18) << setprecision(8) << 0 << "  "
                  << num_pair_os << "  " << num_pair_os_err << "  "
                  << num_pair_os << "  "
                  << Cn2_os_err[0] / total_number_of_events << endl;

        for (int i = 1; i < order_max; i++) {
            double vn2_avg = 0.0;
            double vn2_err = 0.0;
            double Cn2_ss_avg = Cn2_ss[i] / total_number_of_events;
            if (Cn2_ss_avg > 0.) {
                vn2_avg = sqrt(Cn2_ss_avg / num_pair_ss);
                double Cn2_ss_stdsq =
                    (Cn2_ss_err[i] / total_number_of_events
                     - Cn2_ss_avg * Cn2_ss_avg);
                if (Cn2_ss_stdsq > 0) {
                    double Qn2_ss_err =
                        sqrt(Cn2_ss_stdsq / total_number_of_events);
                    vn2_err = Qn2_ss_err / num_pair_ss;
                }
            }
            output_ss << scientific << setw(18) << setprecision(8) << i << "  "
                      << vn2_avg << "  " << vn2_err << "  " << Cn2_ss_avg
                      << "  " << Cn2_ss_err[i] / total_number_of_events << endl;

            vn2_avg = 0.0;
            vn2_err = 0.0;
            double Cn2_os_avg = Cn2_os[i] / total_number_of_events;
            if (Cn2_os_avg > 0.) {
                vn2_avg = sqrt(Cn2_os_avg / num_pair_os);
                double Cn2_os_stdsq =
                    (Cn2_os_err[i] / total_number_of_events
                     - Cn2_os_avg * Cn2_os_avg);
                if (Cn2_os_stdsq > 0) {
                    double Qn2_os_err =
                        sqrt(Cn2_os_stdsq / total_number_of_events);
                    vn2_err = Qn2_os_err / num_pair_os;
                }
            }
            output_os << scientific << setw(18) << setprecision(8) << i << "  "
                      << vn2_avg << "  " << vn2_err << "  " << Cn2_os_avg
                      << "  " << Cn2_os_err[i] / total_number_of_events << endl;
        }
        output_ss.close();
        output_os.close();
    }
}